

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultFrontLoadedReporter.cpp
# Opt level: O2

void __thiscall
ApprovalTests::DefaultFrontLoadedReporter::DefaultFrontLoadedReporter
          (DefaultFrontLoadedReporter *this)

{
  CIBuildOnlyReporter *this_00;
  initializer_list<ApprovalTests::Reporter_*> __l;
  allocator_type local_71;
  _Vector_base<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> local_70;
  element_type *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  shared_ptr<ApprovalTests::Reporter> local_48;
  CIBuildOnlyReporter *local_30;
  
  this_00 = (CIBuildOnlyReporter *)operator_new(0x18);
  ::std::make_shared<ApprovalTests::TextDiffReporter>();
  local_48.super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_58
  ;
  local_48.super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Stack_50._M_pi;
  local_58 = (element_type *)0x0;
  _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  CIBuildOnlyReporter::CIBuildOnlyReporter(this_00,&local_48);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_30;
  local_30 = this_00;
  ::std::vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>::vector
            ((vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> *)
             &local_70,__l,&local_71);
  FirstWorkingReporter::FirstWorkingReporter
            (&this->super_FirstWorkingReporter,
             (vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> *)
             &local_70);
  ::std::_Vector_base<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>::
  ~_Vector_base(&local_70);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_50);
  (this->super_FirstWorkingReporter).super_Reporter._vptr_Reporter =
       (_func_int **)&PTR__FirstWorkingReporter_001a1c48;
  return;
}

Assistant:

DefaultFrontLoadedReporter::DefaultFrontLoadedReporter()
        : FirstWorkingReporter({new CIBuildOnlyReporter()})
    {
    }